

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

znzFile nifti_image_load_prep(nifti_image *nim)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  znzFile file;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong offset;
  znzFile fp;
  char fname [22];
  
  builtin_strncpy(fname,"nifti_image_load_prep",0x16);
  if (nim == (nifti_image *)0x0) {
    if (g_opts_0 < 1) {
      return (znzFile)0x0;
    }
    fwrite("** ERROR: N_image_load: no nifti image\n",0x27,1,_stderr);
    return (znzFile)0x0;
  }
  pcVar4 = nim->iname;
  if (((pcVar4 == (char *)0x0) || (iVar1 = nim->nbyper, (long)iVar1 < 1)) ||
     (sVar2 = nim->nvox, sVar2 == 0)) {
    if (g_opts_0 < 1) {
      return (znzFile)0x0;
    }
    fprintf(_stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",pcVar4,
            (ulong)(uint)nim->nbyper,(ulong)(uint)nim->nvox);
    return (znzFile)0x0;
  }
  pcVar4 = nifti_findimgname(pcVar4,nim->nifti_type);
  if (pcVar4 == (char *)0x0) {
    if (g_opts_0 < 1) {
      return (znzFile)0x0;
    }
    fprintf(_stderr,"** no image file found for \'%s\'\n",nim->iname);
    return (znzFile)0x0;
  }
  iVar3 = nifti_is_gzfile(pcVar4);
  file = znzopen(pcVar4,"rb",iVar3);
  fp = file;
  if (file == (znzFile)0x0) {
    if (0 < g_opts_0) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,"cannot open data file",pcVar4);
    }
    free(pcVar4);
    return (znzFile)0x0;
  }
  free(pcVar4);
  offset = (long)nim->iname_offset;
  if (-1 < (long)nim->iname_offset) {
LAB_00108653:
    lVar5 = znzseek(file,offset,0);
    if (lVar5 < 0) {
      fprintf(_stderr,"** could not seek to offset %u in file \'%s\'\n",offset & 0xffffffff,
              nim->iname);
      Xznzclose(&fp);
      return (znzFile)0x0;
    }
    return file;
  }
  pcVar4 = nim->iname;
  iVar3 = nifti_is_gzfile(pcVar4);
  if (iVar3 == 0) {
    iVar3 = nifti_get_filesize(pcVar4);
    if (iVar3 != 0) {
      uVar7 = sVar2 * (long)iVar1;
      offset = 0;
      if (uVar7 <= (ulong)(long)iVar3) {
        offset = (long)iVar3 - uVar7;
      }
      goto LAB_00108653;
    }
    if (g_opts_0 < 1) goto LAB_00108748;
    pcVar4 = nim->iname;
    pcVar6 = "empty data file";
  }
  else {
    if (g_opts_0 < 1) goto LAB_00108748;
    pcVar6 = "negative offset for compressed file";
  }
  fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,pcVar6,pcVar4);
LAB_00108748:
  Xznzclose(&fp);
  return (znzFile)0x0;
}

Assistant:

static znzFile nifti_image_load_prep( nifti_image *nim )
{
   /* set up data space, open data file and seek, then call nifti_read_buffer */
   size_t  ntot , ii , ioff;
   znzFile fp;
   char   *tmpimgname;
   char    fname[] = { "nifti_image_load_prep" };

   /**- perform sanity checks */
   if( nim == NULL      || nim->iname == NULL ||
       nim->nbyper <= 0 || nim->nvox <= 0       )
   {
      if ( g_opts.debug > 0 ){
         if( !nim ) fprintf(stderr,"** ERROR: N_image_load: no nifti image\n");
         else fprintf(stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",
                      nim->iname, nim->nbyper, (unsigned)nim->nvox);
      }
      return NULL;
   }

   ntot = nifti_get_volsize(nim) ; /* total bytes to read */

   /**- open image data file */

   tmpimgname = nifti_findimgname(nim->iname , nim->nifti_type);
   if( tmpimgname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no image file found for '%s'\n",nim->iname);
      return NULL;
   }

   fp = znzopen(tmpimgname, "rb", nifti_is_gzfile(tmpimgname));
   if (znz_isnull(fp)){
       if(g_opts.debug > 0) LNI_FERR(fname,"cannot open data file",tmpimgname);
       free(tmpimgname);
       return NULL;  /* bad open? */
   }
   free(tmpimgname);

   /**- get image offset: a negative offset means to figure from end of file */
   if( nim->iname_offset < 0 ){
     if( nifti_is_gzfile(nim->iname) ){
        if( g_opts.debug > 0 )
           LNI_FERR(fname,"negative offset for compressed file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ii = nifti_get_filesize( nim->iname ) ;
     if( ii <= 0 ){
        if( g_opts.debug > 0 ) LNI_FERR(fname,"empty data file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ioff = (ii > ntot) ? ii-ntot : 0 ;
   } else {                              /* non-negative offset   */
     ioff = nim->iname_offset ;          /* means use it directly */
   }

   /**- seek to the appropriate read position */
   if( znzseek(fp , (long)ioff , SEEK_SET) < 0 ){
      fprintf(stderr,"** could not seek to offset %u in file '%s'\n",
              (unsigned)ioff, nim->iname);
      znzclose(fp);
      return NULL;
   }

   /**- and return the File pointer */
   return fp;
}